

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::remove_unity_swizzle(CompilerGLSL *this,uint32_t base,string *op)

{
  int iVar1;
  ulong uVar2;
  SPIRType *pSVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  string final_swiz;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = ::std::__cxx11::string::rfind((char)op,0x2e);
  if (uVar2 + 1 < 2) {
    return false;
  }
  ::std::__cxx11::string::substr((ulong)&local_70,(ulong)op);
  if ((this->backend).swizzle_is_function == true) {
    if (1 < local_68) {
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
      iVar1 = ::std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (iVar1 == 0) {
        if (local_68 < 2) goto LAB_0034c7c6;
        local_70[local_68 - 2] = 0;
        local_68 = local_68 - 2;
        goto LAB_0034c703;
      }
    }
LAB_0034c6dc:
    bVar6 = false;
  }
  else {
LAB_0034c703:
    if (local_68 != 0) {
      uVar5 = 0;
      do {
        if ((uVar5 == 4) || (local_70[uVar5] != "xyzw"[uVar5])) goto LAB_0034c6dc;
        uVar5 = uVar5 + 1;
      } while (local_68 != uVar5);
    }
    pSVar3 = Compiler::expression_type(&this->super_Compiler,base);
    if ((pSVar3->columns != 1) || ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size != 0))
    {
      __assert_fail("type.columns == 1 && type.array.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x2d1f,
                    "bool spirv_cross::CompilerGLSL::remove_unity_swizzle(uint32_t, string &)");
    }
    bVar6 = true;
    if (local_68 == pSVar3->vecsize) {
      if (op->_M_string_length < uVar2) {
        ::std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar2);
LAB_0034c7c6:
        uVar4 = ::std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        _Unwind_Resume(uVar4);
      }
      op->_M_string_length = uVar2;
      (op->_M_dataplus)._M_p[uVar2] = '\0';
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return bVar6;
}

Assistant:

bool CompilerGLSL::remove_unity_swizzle(uint32_t base, string &op)
{
	auto pos = op.find_last_of('.');
	if (pos == string::npos || pos == 0)
		return false;

	string final_swiz = op.substr(pos + 1, string::npos);

	if (backend.swizzle_is_function)
	{
		if (final_swiz.size() < 2)
			return false;

		if (final_swiz.substr(final_swiz.size() - 2, string::npos) == "()")
			final_swiz.erase(final_swiz.size() - 2, string::npos);
		else
			return false;
	}

	// Check if final swizzle is of form .x, .xy, .xyz, .xyzw or similar.
	// If so, and previous swizzle is of same length,
	// we can drop the final swizzle altogether.
	for (uint32_t i = 0; i < final_swiz.size(); i++)
	{
		static const char expected[] = { 'x', 'y', 'z', 'w' };
		if (i >= 4 || final_swiz[i] != expected[i])
			return false;
	}

	auto &type = expression_type(base);

	// Sanity checking ...
	assert(type.columns == 1 && type.array.empty());

	if (type.vecsize == final_swiz.size())
		op.erase(pos, string::npos);
	return true;
}